

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rawsetp(lua_State *L,int idx,void *p)

{
  StkId pTVar1;
  int iVar2;
  TValue *pTVar3;
  TValue *io2;
  TValue *io1;
  TValue *io;
  TValue *slot;
  TValue k;
  StkId o;
  void *p_local;
  int idx_local;
  lua_State *L_local;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x48c,"void lua_rawsetp(lua_State *, int, const void *)");
  }
  if ((long)L->top - (long)L->ci->func >> 4 < 2) {
    __assert_fail("((1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x48d,"void lua_rawsetp(lua_State *, int, const void *)");
  }
  k._8_8_ = index2addr(L,idx);
  if (((TValue *)k._8_8_)->tt_ != 0x8005) {
    __assert_fail("(((((o))->tt_) == (((5) | (1 << 15))))) && \"table expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x48f,"void lua_rawsetp(lua_State *, int, const void *)");
  }
  k.value_.b._0_2_ = 2;
  slot = (TValue *)p;
  if (((TValue *)k._8_8_)->tt_ != 0x8005) {
    __assert_fail("((((o))->tt_) == (((5) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x491,"void lua_rawsetp(lua_State *, int, const void *)");
  }
  if (((((TValue *)k._8_8_)->value_).gc)->tt != '\x05') {
    __assert_fail("(((o)->value_).gc)->tt == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x491,"void lua_rawsetp(lua_State *, int, const void *)");
  }
  pTVar3 = luaH_set(L,(Table *)(((TValue *)k._8_8_)->value_).gc,(TValue *)&slot);
  pTVar1 = L->top;
  pTVar3->value_ = pTVar1[-1].value_;
  pTVar3->tt_ = pTVar1[-1].tt_;
  if ((pTVar3->tt_ & 0x8000) != 0) {
    if ((pTVar3->tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x492,"void lua_rawsetp(lua_State *, int, const void *)");
    }
    if ((pTVar3->tt_ & 0x7f) != (ushort)((pTVar3->value_).gc)->tt) {
LAB_00116c59:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x492,"void lua_rawsetp(lua_State *, int, const void *)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar3->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x492,"void lua_rawsetp(lua_State *, int, const void *)");
      }
      if ((((pTVar3->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00116c59;
    }
  }
  if ((L->top[-1].tt_ & 0x8000) != 0) {
    if ((*(ushort *)(k._8_8_ + 8) & 0x8000) == 0) {
      __assert_fail("(((o)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x493,"void lua_rawsetp(lua_State *, int, const void *)");
    }
    if ((*(byte *)(*(long *)k._8_8_ + 9) & 0x20) != 0) {
      if ((L->top[-1].tt_ & 0x8000) == 0) {
        __assert_fail("(((L->top - 1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x493,"void lua_rawsetp(lua_State *, int, const void *)");
      }
      if (((L->top[-1].value_.gc)->marked & 0x18) != 0) {
        if ((*(ushort *)(k._8_8_ + 8) & 0x8000) == 0) {
          __assert_fail("(((o)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x493,"void lua_rawsetp(lua_State *, int, const void *)");
        }
        luaC_barrierback_(L,*(GCObject **)k._8_8_);
      }
    }
  }
  L->top = L->top + -1;
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x495,"void lua_rawsetp(lua_State *, int, const void *)");
}

Assistant:

LUA_API void lua_rawsetp (lua_State *L, int idx, const void *p) {
  StkId o;
  TValue k, *slot;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2addr(L, idx);
  api_check(L, ttisLtable(o), "table expected");
  setpvalue(&k, cast(void *, p));
  slot = luaH_set(L, hvalue(o), &k);
  setobj2t(L, slot, L->top - 1);
  luaC_barrierback(L, gcvalue(o), L->top - 1);
  L->top--;
  lua_unlock(L);
}